

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O1

void __thiscall xercesc_4_0::AllContentModel::~AllContentModel(AllContentModel *this)

{
  ulong uVar1;
  
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__AllContentModel_00418c70
  ;
  if (this->fCount != 0) {
    uVar1 = 0;
    do {
      if (this->fChildren[uVar1] != (QName *)0x0) {
        (*(this->fChildren[uVar1]->super_XSerializable)._vptr_XSerializable[1])();
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->fCount);
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildren);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fChildOptional);
  return;
}

Assistant:

AllContentModel::~AllContentModel()
{
    for (XMLSize_t index = 0; index < fCount; index++)
        delete fChildren[index];
    fMemoryManager->deallocate(fChildren); //delete [] fChildren;
    fMemoryManager->deallocate(fChildOptional); //delete [] fChildOptional;
}